

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EAMAdapter.cpp
# Opt level: O2

RealType __thiscall OpenMD::EAMAdapter::getDr(EAMAdapter *this)

{
  FuncflParameters funcflParam;
  FuncflParameters local_88;
  
  getFuncflParam(&local_88,this);
  FuncflParameters::~FuncflParameters(&local_88);
  return local_88.dr;
}

Assistant:

RealType EAMAdapter::getDr() {
    FuncflParameters funcflParam = getFuncflParam();
    return funcflParam.dr;
  }